

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

PtexCachedReader * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::get
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,StringKey *key)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  Entry *pEVar4;
  uint uVar5;
  StringKey *in_RSI;
  PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *in_RDI;
  Entry *e;
  uint32_t i;
  PtexCachedReader *result;
  uint32_t hash;
  Entry *entries;
  uint32_t mask;
  undefined4 in_stack_ffffffffffffffc8;
  PtexCachedReader *this_00;
  
  uVar1 = in_RDI->_numEntries;
  pEVar4 = getEntries(in_RDI);
  uVar3 = StringKey::hash(in_RSI);
  this_00 = (PtexCachedReader *)0x0;
  while( true ) {
    uVar5 = uVar3 & uVar1 - 1;
    bVar2 = StringKey::matches((StringKey *)this_00,
                               (StringKey *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
    if (bVar2) {
      return pEVar4[uVar5].value;
    }
    if (pEVar4[uVar5].value == (PtexCachedReader *)0x0) break;
    uVar3 = uVar3 + 1;
  }
  return this_00;
}

Assistant:

Value get(Key& key)
    {
        uint32_t mask = _numEntries-1;
        Entry* entries = getEntries();
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
            if (e.value == 0) {
                break;
            }
        }

        return result;
    }